

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
::FindEntryWithKey<Js::RecyclableObject*>
          (SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,RecyclableObject **key)

{
  type tVar1;
  bool bVar2;
  int **ppiVar3;
  ValueEntry<bool,_JsUtil::(anonymous_namespace)::ValueEntryData<bool>_> **ppVVar4;
  type key_00;
  TBKey k;
  int last;
  int i;
  EntryType *localEntries;
  uint targetBucket;
  hash_t hashCode;
  int *localBuckets;
  RecyclableObject **key_local;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  localBuckets = (int *)key;
  key_local = (RecyclableObject **)this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
  _targetBucket = *ppiVar3;
  if (_targetBucket != (int *)0x0) {
    localEntries._4_4_ =
         GetHashCodeWithKey<Js::RecyclableObject*>((RecyclableObject **)localBuckets);
    localEntries._0_4_ =
         SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         ::GetBucket((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                      *)this,localEntries._4_4_);
    ppVVar4 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)(this + 0x10));
    _last = *ppVVar4;
    k._4_4_ = _targetBucket[(uint)localEntries];
    k._0_4_ = -1;
    while (-1 < k._4_4_) {
      key_00 = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
               ::GetKey<true>((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                               *)this,k._4_4_);
      tVar1 = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              ::RemoveIfCollected<true>
                        ((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                          *)this,key_00,(int *)((long)&k + 4),(int)k,(uint)localEntries);
      if (!tVar1) {
        bVar2 = RecyclerPointerComparer<Js::RecyclableObject_*>::Equals
                          (key_00,*(RecyclableObject **)localBuckets);
        if (bVar2) {
          return k._4_4_;
        }
        k._0_4_ = k._4_4_;
        k._4_4_ = _last[k._4_4_].super_ValueEntryData<bool>.next;
      }
    }
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key)
        {
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }
                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        return i;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }
            return -1;
        }